

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

int ImGui::PlotEx(ImGuiPlotType plot_type,char *label,_func_float_void_ptr_int *values_getter,
                 void *data,int values_count,int values_offset,char *overlay_text,float scale_min,
                 float scale_max,ImVec2 frame_size)

{
  undefined8 uVar1;
  ImVec2 p_max;
  ulong uVar2;
  bool bVar3;
  int iVar4;
  undefined8 in_RCX;
  ImDrawList *in_RDX;
  int in_EDI;
  ImGuiWindowTempData *min;
  int in_R8D;
  int in_R9D;
  float in_XMM0_Da;
  float fVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  float in_XMM1_Da;
  undefined1 in_ZMM2 [64];
  long in_stack_00000008;
  ImVec2 pos1;
  ImVec2 pos0;
  ImVec2 tp1;
  float v1_1;
  int v1_idx;
  float t1;
  int n;
  ImU32 col_hovered;
  ImU32 col_base;
  float histogram_zero_line_t;
  ImVec2 tp0;
  float t0;
  float v0;
  float inv_scale;
  float t_step;
  float v1;
  float v0_1;
  int v_idx;
  float t;
  int item_count;
  int res_w;
  int idx_hovered;
  int values_count_min;
  float v;
  int i;
  float v_max;
  float v_min;
  bool hovered;
  ImRect total_bb;
  ImRect inner_bb;
  ImRect frame_bb;
  ImVec2 label_size;
  ImGuiID id;
  ImGuiStyle *style;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImVec2 *in_stack_fffffffffffffdd8;
  undefined4 in_stack_fffffffffffffde0;
  ImDrawFlags in_stack_fffffffffffffde4;
  ImVec2 *in_stack_fffffffffffffde8;
  ImVec2 *in_stack_fffffffffffffdf0;
  float in_stack_fffffffffffffdf8;
  undefined4 in_stack_fffffffffffffdfc;
  ImU32 IVar14;
  ImGuiWindow *in_stack_fffffffffffffe00;
  ImGuiID id_00;
  undefined4 in_stack_fffffffffffffe08;
  ImU32 in_stack_fffffffffffffe0c;
  ImDrawList *in_stack_fffffffffffffe10;
  ImDrawList *in_stack_fffffffffffffe18;
  undefined1 hide_text_after_hash;
  undefined4 in_stack_fffffffffffffe20;
  float in_stack_fffffffffffffe24;
  ImRect *in_stack_fffffffffffffe28;
  ImVec2 in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe38;
  float in_stack_fffffffffffffe3c;
  ImDrawList *in_stack_fffffffffffffe40;
  float in_stack_fffffffffffffe48;
  float fVar15;
  float in_stack_fffffffffffffe4c;
  ImVec2 in_stack_fffffffffffffe50;
  float local_194;
  ImVec2 local_154;
  ImVec2 local_14c;
  undefined8 local_144;
  undefined8 local_13c;
  ImVec2 local_134;
  float local_12c;
  uint local_128;
  float local_124;
  int local_120;
  ImU32 local_11c;
  ImU32 local_118;
  float local_114;
  ImVec2 local_110;
  float local_108;
  float local_104;
  float local_100;
  float local_fc;
  float local_f8;
  float local_f4;
  uint local_f0;
  float local_ec;
  int local_e8;
  int local_e4;
  uint local_e0;
  int local_dc;
  float local_c8;
  int local_c4;
  float local_c0;
  float local_bc;
  byte local_b5;
  ImVec2 local_b4;
  ImVec2 local_ac;
  ImRect local_a4;
  ImVec2 local_94;
  ImVec2 local_8c;
  ImRect local_84;
  ImVec2 local_74;
  ImRect local_6c;
  undefined8 local_5c;
  ImGuiID local_54;
  ImGuiStyle *local_50;
  ImGuiWindow *local_48;
  ImGuiContext *local_40;
  float local_38;
  float local_34;
  int local_30;
  int local_2c;
  undefined8 local_28;
  ImDrawList *local_20;
  int local_10;
  undefined8 local_c;
  uint local_4;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  undefined1 extraout_var_03 [56];
  undefined1 extraout_var_04 [56];
  undefined1 extraout_var_05 [56];
  
  local_c = vmovlpd_avx(in_ZMM2._0_16_);
  local_40 = GImGui;
  local_38 = in_XMM1_Da;
  local_34 = in_XMM0_Da;
  local_30 = in_R9D;
  local_2c = in_R8D;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_10 = in_EDI;
  local_48 = GetCurrentWindow();
  if ((local_48->SkipItems & 1U) == 0) {
    local_50 = &local_40->Style;
    local_54 = ImGuiWindow::GetID(in_stack_fffffffffffffe00,
                                  (char *)CONCAT44(in_stack_fffffffffffffdfc,
                                                   in_stack_fffffffffffffdf8),
                                  (char *)in_stack_fffffffffffffdf0);
    auVar7._0_8_ = CalcTextSize((char *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08
                                                ),(char *)in_stack_fffffffffffffe00,
                                SUB41((uint)in_stack_fffffffffffffdfc >> 0x18,0),
                                in_stack_fffffffffffffdf8);
    id_00 = (ImGuiID)((ulong)in_stack_fffffffffffffe00 >> 0x20);
    auVar7._8_56_ = extraout_var;
    local_5c = vmovlpd_avx(auVar7._0_16_);
    if (((float)local_c == 0.0) && (!NAN((float)local_c))) {
      fVar5 = CalcItemWidth();
      local_c = CONCAT44(local_c._4_4_,fVar5);
    }
    if ((local_c._4_4_ == 0.0) && (!NAN(local_c._4_4_))) {
      auVar6 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40000000),0),
                               ZEXT416((uint)(local_50->FramePadding).y),ZEXT416(local_5c._4_4_));
      local_c = CONCAT44(auVar6._0_4_,(float)local_c);
    }
    min = &local_48->DC;
    auVar8._0_8_ = ::operator+(in_stack_fffffffffffffdd8,(ImVec2 *)0x5c1aaa);
    auVar8._8_56_ = extraout_var_00;
    local_74 = (ImVec2)vmovlpd_avx(auVar8._0_16_);
    ImRect::ImRect(&local_6c,&min->CursorPos,&local_74);
    auVar9._0_8_ = ::operator+(in_stack_fffffffffffffdd8,(ImVec2 *)0x5c1af1);
    auVar9._8_56_ = extraout_var_01;
    local_8c = (ImVec2)vmovlpd_avx(auVar9._0_16_);
    auVar10._0_8_ = ::operator-(in_stack_fffffffffffffdd8,(ImVec2 *)0x5c1b13);
    auVar10._8_56_ = extraout_var_02;
    local_94 = (ImVec2)vmovlpd_avx(auVar10._0_16_);
    ImRect::ImRect(&local_84,&local_8c,&local_94);
    if ((float)local_5c <= 0.0) {
      local_194 = 0.0;
    }
    else {
      local_194 = (local_50->ItemInnerSpacing).x + (float)local_5c;
    }
    ImVec2::ImVec2(&local_b4,local_194,0.0);
    auVar11._0_8_ = ::operator+(in_stack_fffffffffffffdd8,(ImVec2 *)0x5c1bd7);
    auVar11._8_56_ = extraout_var_03;
    local_ac = (ImVec2)vmovlpd_avx(auVar11._0_16_);
    ImRect::ImRect(&local_a4,&local_6c.Min,&local_ac);
    ItemSize((ImRect *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
             (float)((ulong)in_stack_fffffffffffffdd8 >> 0x20));
    bVar3 = ItemAdd((ImRect *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),id_00,
                    (ImRect *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),
                    (ImGuiItemFlags)((ulong)in_stack_fffffffffffffdf0 >> 0x20));
    if (bVar3) {
      local_b5 = ItemHoverable((ImRect *)
                               CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),
                               (ImGuiID)((ulong)in_stack_fffffffffffffdf0 >> 0x20));
      if (((local_34 == 3.4028235e+38) && (!NAN(local_34))) ||
         ((local_38 == 3.4028235e+38 && (!NAN(local_38))))) {
        local_bc = 3.4028235e+38;
        local_c0 = -3.4028235e+38;
        for (local_c4 = 0; local_c4 < local_2c; local_c4 = local_c4 + 1) {
          local_c8 = (float)(*(code *)local_20)(local_28,local_c4);
          if (!NAN(local_c8)) {
            local_bc = ImMin<float>(local_bc,local_c8);
            local_c0 = ImMax<float>(local_c0,local_c8);
          }
        }
        if ((local_34 == 3.4028235e+38) && (!NAN(local_34))) {
          local_34 = local_bc;
        }
        if ((local_38 == 3.4028235e+38) && (!NAN(local_38))) {
          local_38 = local_c0;
        }
      }
      GetColorU32((ImGuiCol)((ulong)in_stack_fffffffffffffdf0 >> 0x20),
                  SUB84(in_stack_fffffffffffffdf0,0));
      p_max.y = in_stack_fffffffffffffe4c;
      p_max.x = in_stack_fffffffffffffe48;
      RenderFrame(in_stack_fffffffffffffe50,p_max,(ImU32)((ulong)in_stack_fffffffffffffe40 >> 0x20),
                  SUB81((ulong)in_stack_fffffffffffffe40 >> 0x18,0),in_stack_fffffffffffffe3c);
      local_dc = 1;
      if (local_10 == 0) {
        local_dc = 2;
      }
      local_e0 = 0xffffffff;
      if (local_dc <= local_2c) {
        local_e4 = ImMin<int>((int)(float)local_c,local_2c);
        iVar4 = 0;
        if (local_10 == 0) {
          iVar4 = -1;
        }
        local_e4 = local_e4 + iVar4;
        local_e8 = 0;
        if (local_10 == 0) {
          local_e8 = -1;
        }
        local_e8 = local_2c + local_e8;
        if (((local_b5 & 1) != 0) &&
           (bVar3 = ImRect::Contains(&local_84,&(local_40->IO).MousePos), bVar3)) {
          local_ec = ImClamp<float>(((local_40->IO).MousePos.x - local_84.Min.x) /
                                    (local_84.Max.x - local_84.Min.x),0.0,0.9999);
          local_f0 = (uint)(local_ec * (float)local_e8);
          local_f4 = (float)(*(code *)local_20)(local_28,(long)(int)(local_f0 + local_30) %
                                                         (long)local_2c & 0xffffffff);
          local_f8 = (float)(*(code *)local_20)(local_28,(long)(int)(local_f0 + 1 + local_30) %
                                                         (long)local_2c & 0xffffffff);
          if (local_10 == 0) {
            SetTooltip((char *)(double)local_f4,(double)local_f8,"%d: %8.4g\n%d: %8.4g",
                       (ulong)local_f0,(ulong)(local_f0 + 1));
          }
          else if (local_10 == 1) {
            SetTooltip((char *)(double)local_f4,"%d: %8.4g",(ulong)local_f0);
          }
          local_e0 = local_f0;
        }
        local_fc = 1.0 / (float)local_e4;
        if ((local_34 != local_38) || (NAN(local_34) || NAN(local_38))) {
          local_100 = 1.0 / (local_38 - local_34);
        }
        else {
          local_100 = 0.0;
        }
        in_stack_fffffffffffffe40 = local_20;
        local_104 = (float)(*(code *)local_20)(local_28,(long)local_30 % (long)local_2c & 0xffffffff
                                              );
        local_108 = 0.0;
        fVar15 = 0.0;
        fVar5 = ImSaturate((local_104 - local_34) * local_100);
        ImVec2::ImVec2(&local_110,fVar15,1.0 - fVar5);
        if (0.0 <= local_34 * local_38) {
          uVar1 = vcmpss_avx512f(ZEXT416((uint)local_34),(undefined1  [16])0x0,1);
          fVar5 = (float)((uint)!(bool)((byte)uVar1 & 1) * 0x3f800000);
        }
        else {
          auVar6 = vfmadd213ss_fma(ZEXT416((uint)local_100),ZEXT416((uint)local_34),
                                   SUB6416(ZEXT464(0x3f800000),0));
          fVar5 = auVar6._0_4_;
        }
        local_114 = fVar5;
        local_118 = GetColorU32((ImGuiCol)((ulong)in_stack_fffffffffffffdf0 >> 0x20),
                                SUB84(in_stack_fffffffffffffdf0,0));
        local_11c = GetColorU32((ImGuiCol)((ulong)in_stack_fffffffffffffdf0 >> 0x20),
                                SUB84(in_stack_fffffffffffffdf0,0));
        for (local_120 = 0; local_120 < local_e4; local_120 = local_120 + 1) {
          local_124 = local_108 + local_fc;
          auVar6._0_4_ = (float)local_e8;
          auVar6._4_12_ = SUB6012((undefined1  [60])0x0,0);
          auVar6 = vfmadd213ss_fma(auVar6,ZEXT416((uint)local_108),SUB6416(ZEXT464(0x3f000000),0));
          local_128 = (uint)auVar6._0_4_;
          in_stack_fffffffffffffe18 = local_20;
          local_12c = (float)(*(code *)local_20)(local_28,(long)(int)(local_128 + 1 + local_30) %
                                                          (long)local_2c & 0xffffffff);
          in_stack_fffffffffffffe24 = local_124;
          fVar15 = ImSaturate((local_12c - local_34) * local_100);
          ImVec2::ImVec2(&local_134,in_stack_fffffffffffffe24,1.0 - fVar15);
          auVar12._0_8_ =
               ImLerp(in_stack_fffffffffffffde8,
                      (ImVec2 *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                      in_stack_fffffffffffffdd8);
          auVar12._8_56_ = extraout_var_04;
          local_13c = vmovlpd_avx(auVar12._0_16_);
          in_stack_fffffffffffffe28 = &local_84;
          in_stack_fffffffffffffe30 = (ImVec2)&local_84.Max;
          if (local_10 != 0) {
            ImVec2::ImVec2(&local_14c,local_134.x,local_114);
          }
          auVar13._0_8_ =
               ImLerp(in_stack_fffffffffffffde8,
                      (ImVec2 *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                      in_stack_fffffffffffffdd8);
          auVar13._8_56_ = extraout_var_05;
          local_144 = vmovlpd_avx(auVar13._0_16_);
          if (local_10 == 0) {
            in_stack_fffffffffffffe10 = local_48->DrawList;
            in_stack_fffffffffffffe0c = local_118;
            if (local_e0 == local_128) {
              in_stack_fffffffffffffe0c = local_11c;
            }
            ImDrawList::AddLine(in_stack_fffffffffffffe40,
                                (ImVec2 *)CONCAT44(fVar5,in_stack_fffffffffffffe38),
                                (ImVec2 *)in_stack_fffffffffffffe30,
                                (ImU32)((ulong)in_stack_fffffffffffffe28 >> 0x20),
                                SUB84(in_stack_fffffffffffffe28,0));
          }
          else if (local_10 == 1) {
            if ((float)local_13c + 2.0 <= (float)local_144) {
              uVar2 = (ulong)local_144 >> 0x20;
              local_144 = CONCAT44((int)uVar2,(float)local_144 - 1.0);
            }
            IVar14 = local_118;
            if (local_e0 == local_128) {
              IVar14 = local_11c;
            }
            ImDrawList::AddRectFilled
                      (local_48->DrawList,(ImVec2 *)CONCAT44(IVar14,in_stack_fffffffffffffdf8),
                       in_stack_fffffffffffffdf0,(ImU32)((ulong)in_stack_fffffffffffffde8 >> 0x20),
                       SUB84(in_stack_fffffffffffffde8,0),in_stack_fffffffffffffde4);
          }
          local_108 = local_124;
        }
      }
      if (in_stack_00000008 != 0) {
        ImVec2::ImVec2(&local_154,local_6c.Min.x,local_6c.Min.y + (local_50->FramePadding).y);
        ImVec2::ImVec2((ImVec2 *)&stack0xfffffffffffffea4,0.5,0.0);
        RenderTextClipped((ImVec2 *)in_stack_fffffffffffffe30,&in_stack_fffffffffffffe28->Min,
                          (char *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                          (char *)in_stack_fffffffffffffe18,(ImVec2 *)in_stack_fffffffffffffe10,
                          (ImVec2 *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),
                          (ImRect *)in_stack_fffffffffffffe40);
      }
      hide_text_after_hash = (undefined1)((ulong)in_stack_fffffffffffffe18 >> 0x38);
      if (0.0 < (float)local_5c) {
        ImVec2::ImVec2((ImVec2 *)&stack0xfffffffffffffe9c,
                       local_6c.Max.x + (local_50->ItemInnerSpacing).x,local_84.Min.y);
        RenderText(in_stack_fffffffffffffe30,(char *)in_stack_fffffffffffffe28,
                   (char *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                   (bool)hide_text_after_hash);
      }
      local_4 = local_e0;
    }
    else {
      local_4 = 0xffffffff;
    }
  }
  else {
    local_4 = 0xffffffff;
  }
  return local_4;
}

Assistant:

int ImGui::PlotEx(ImGuiPlotType plot_type, const char* label, float (*values_getter)(void* data, int idx), void* data, int values_count, int values_offset, const char* overlay_text, float scale_min, float scale_max, ImVec2 frame_size)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return -1;

    const ImGuiStyle& style = g.Style;
    const ImGuiID id = window->GetID(label);

    const ImVec2 label_size = CalcTextSize(label, NULL, true);
    if (frame_size.x == 0.0f)
        frame_size.x = CalcItemWidth();
    if (frame_size.y == 0.0f)
        frame_size.y = label_size.y + (style.FramePadding.y * 2);

    const ImRect frame_bb(window->DC.CursorPos, window->DC.CursorPos + frame_size);
    const ImRect inner_bb(frame_bb.Min + style.FramePadding, frame_bb.Max - style.FramePadding);
    const ImRect total_bb(frame_bb.Min, frame_bb.Max + ImVec2(label_size.x > 0.0f ? style.ItemInnerSpacing.x + label_size.x : 0.0f, 0));
    ItemSize(total_bb, style.FramePadding.y);
    if (!ItemAdd(total_bb, 0, &frame_bb))
        return -1;
    const bool hovered = ItemHoverable(frame_bb, id);

    // Determine scale from values if not specified
    if (scale_min == FLT_MAX || scale_max == FLT_MAX)
    {
        float v_min = FLT_MAX;
        float v_max = -FLT_MAX;
        for (int i = 0; i < values_count; i++)
        {
            const float v = values_getter(data, i);
            if (v != v) // Ignore NaN values
                continue;
            v_min = ImMin(v_min, v);
            v_max = ImMax(v_max, v);
        }
        if (scale_min == FLT_MAX)
            scale_min = v_min;
        if (scale_max == FLT_MAX)
            scale_max = v_max;
    }

    RenderFrame(frame_bb.Min, frame_bb.Max, GetColorU32(ImGuiCol_FrameBg), true, style.FrameRounding);

    const int values_count_min = (plot_type == ImGuiPlotType_Lines) ? 2 : 1;
    int idx_hovered = -1;
    if (values_count >= values_count_min)
    {
        int res_w = ImMin((int)frame_size.x, values_count) + ((plot_type == ImGuiPlotType_Lines) ? -1 : 0);
        int item_count = values_count + ((plot_type == ImGuiPlotType_Lines) ? -1 : 0);

        // Tooltip on hover
        if (hovered && inner_bb.Contains(g.IO.MousePos))
        {
            const float t = ImClamp((g.IO.MousePos.x - inner_bb.Min.x) / (inner_bb.Max.x - inner_bb.Min.x), 0.0f, 0.9999f);
            const int v_idx = (int)(t * item_count);
            IM_ASSERT(v_idx >= 0 && v_idx < values_count);

            const float v0 = values_getter(data, (v_idx + values_offset) % values_count);
            const float v1 = values_getter(data, (v_idx + 1 + values_offset) % values_count);
            if (plot_type == ImGuiPlotType_Lines)
                SetTooltip("%d: %8.4g\n%d: %8.4g", v_idx, v0, v_idx + 1, v1);
            else if (plot_type == ImGuiPlotType_Histogram)
                SetTooltip("%d: %8.4g", v_idx, v0);
            idx_hovered = v_idx;
        }

        const float t_step = 1.0f / (float)res_w;
        const float inv_scale = (scale_min == scale_max) ? 0.0f : (1.0f / (scale_max - scale_min));

        float v0 = values_getter(data, (0 + values_offset) % values_count);
        float t0 = 0.0f;
        ImVec2 tp0 = ImVec2( t0, 1.0f - ImSaturate((v0 - scale_min) * inv_scale) );                       // Point in the normalized space of our target rectangle
        float histogram_zero_line_t = (scale_min * scale_max < 0.0f) ? (1 + scale_min * inv_scale) : (scale_min < 0.0f ? 0.0f : 1.0f);   // Where does the zero line stands

        const ImU32 col_base = GetColorU32((plot_type == ImGuiPlotType_Lines) ? ImGuiCol_PlotLines : ImGuiCol_PlotHistogram);
        const ImU32 col_hovered = GetColorU32((plot_type == ImGuiPlotType_Lines) ? ImGuiCol_PlotLinesHovered : ImGuiCol_PlotHistogramHovered);

        for (int n = 0; n < res_w; n++)
        {
            const float t1 = t0 + t_step;
            const int v1_idx = (int)(t0 * item_count + 0.5f);
            IM_ASSERT(v1_idx >= 0 && v1_idx < values_count);
            const float v1 = values_getter(data, (v1_idx + values_offset + 1) % values_count);
            const ImVec2 tp1 = ImVec2( t1, 1.0f - ImSaturate((v1 - scale_min) * inv_scale) );

            // NB: Draw calls are merged together by the DrawList system. Still, we should render our batch are lower level to save a bit of CPU.
            ImVec2 pos0 = ImLerp(inner_bb.Min, inner_bb.Max, tp0);
            ImVec2 pos1 = ImLerp(inner_bb.Min, inner_bb.Max, (plot_type == ImGuiPlotType_Lines) ? tp1 : ImVec2(tp1.x, histogram_zero_line_t));
            if (plot_type == ImGuiPlotType_Lines)
            {
                window->DrawList->AddLine(pos0, pos1, idx_hovered == v1_idx ? col_hovered : col_base);
            }
            else if (plot_type == ImGuiPlotType_Histogram)
            {
                if (pos1.x >= pos0.x + 2.0f)
                    pos1.x -= 1.0f;
                window->DrawList->AddRectFilled(pos0, pos1, idx_hovered == v1_idx ? col_hovered : col_base);
            }

            t0 = t1;
            tp0 = tp1;
        }
    }

    // Text overlay
    if (overlay_text)
        RenderTextClipped(ImVec2(frame_bb.Min.x, frame_bb.Min.y + style.FramePadding.y), frame_bb.Max, overlay_text, NULL, NULL, ImVec2(0.5f, 0.0f));

    if (label_size.x > 0.0f)
        RenderText(ImVec2(frame_bb.Max.x + style.ItemInnerSpacing.x, inner_bb.Min.y), label);

    // Return hovered index or -1 if none are hovered.
    // This is currently not exposed in the public API because we need a larger redesign of the whole thing, but in the short-term we are making it available in PlotEx().
    return idx_hovered;
}